

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

bool __thiscall soul::AST::ArrayElementRef::isResolved(ArrayElementRef *this)

{
  bool local_53;
  bool local_51;
  bool local_41;
  pool_ptr<soul::AST::Expression> local_40 [3];
  byte local_21;
  pool_ptr<soul::AST::Expression> local_20;
  ArrayElementRef *local_18;
  ArrayElementRef *this_local;
  
  local_21 = 0;
  local_41 = false;
  local_18 = this;
  if ((this->isSlice & 1U) == 0) {
    local_20.object = (this->object).object;
    local_21 = 1;
    local_41 = isResolvedAsValue(&local_20);
    local_53 = false;
    if (local_41) {
      local_40[0].object = (this->startIndex).object;
      local_53 = isResolvedAsValue(local_40);
    }
    local_51 = local_53;
  }
  else {
    local_51 = isSliceRangeValid(this);
  }
  this_local._7_1_ = local_51;
  if (local_41 != false) {
    pool_ptr<soul::AST::Expression>::~pool_ptr(local_40);
  }
  if ((local_21 & 1) != 0) {
    pool_ptr<soul::AST::Expression>::~pool_ptr(&local_20);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool isResolved() const override
        {
            return isSlice ? isSliceRangeValid()
                           : (isResolvedAsValue (object) && isResolvedAsValue (startIndex));
        }